

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Duration::InternalSwap(Duration *this,Duration *other)

{
  int32 iVar1;
  void *pvVar2;
  int64 iVar3;
  UnknownFieldSet *other_00;
  
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002e44dc;
LAB_002e44cb:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002e44cb;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
LAB_002e44dc:
  iVar3 = this->seconds_;
  this->seconds_ = other->seconds_;
  other->seconds_ = iVar3;
  iVar1 = this->nanos_;
  this->nanos_ = other->nanos_;
  other->nanos_ = iVar1;
  return;
}

Assistant:

void Duration::InternalSwap(Duration* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Duration, nanos_)
      + sizeof(Duration::nanos_)
      - PROTOBUF_FIELD_OFFSET(Duration, seconds_)>(
          reinterpret_cast<char*>(&seconds_),
          reinterpret_cast<char*>(&other->seconds_));
}